

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fd_filter.cc
# Opt level: O0

void __thiscall
sptk::reaper::FdFilter::RationalApproximation(FdFilter *this,float a,int *k,int *l,int qlim)

{
  int iVar1;
  int iVar2;
  int in_ECX;
  int *in_RDX;
  int *in_RSI;
  float in_XMM0_Da;
  float fVar3;
  double dVar4;
  double dVar5;
  int i;
  int ip;
  int ai;
  float e;
  float ps;
  float pp;
  float qq;
  float em;
  float q;
  float af;
  float aa;
  undefined4 local_54;
  undefined4 local_3c;
  undefined4 local_38;
  undefined4 local_34;
  undefined4 local_30;
  
  local_38 = 1.0;
  local_3c = 1.0;
  dVar4 = std::fabs((double)(ulong)(uint)in_XMM0_Da);
  iVar1 = (int)SUB84(dVar4,0);
  local_30 = 0.0;
  local_34 = 1.0;
  while (local_30 = local_30 + 1.0, local_30 <= (float)in_ECX) {
    fVar3 = local_30 * (SUB84(dVar4,0) - (float)iVar1);
    iVar2 = (int)(fVar3 + 0.5);
    dVar5 = std::fabs((double)(ulong)(uint)((fVar3 - (float)iVar2) / local_30));
    if (SUB84(dVar5,0) < local_34) {
      local_3c = (float)iVar2;
      local_38 = local_30;
      local_34 = SUB84(dVar5,0);
    }
  }
  *in_RSI = (int)((float)iVar1 * local_38 + local_3c);
  if (in_XMM0_Da <= 0.0) {
    local_54 = -*in_RSI;
  }
  else {
    local_54 = *in_RSI;
  }
  *in_RSI = local_54;
  *in_RDX = (int)local_38;
  return;
}

Assistant:

void FdFilter::RationalApproximation(float a, int *k, int *l, int qlim) {
  float aa, af, q, em, qq = 1.0, pp = 1.0, ps, e;
  int ai, ip, i;

  aa = fabs(a);
  ai = static_cast<int>(aa);
  i = ai;
  af = aa - i;
  q = 0;
  em = 1.0;
  while (++q <= qlim) {
    ps = q * af;
    ip = static_cast<int>(ps + 0.5);
    e = fabs((ps - static_cast<float>(ip)) / q);
    if (e < em) {
      em = e;
      pp = ip;
      qq = q;
    }
  }
  *k = static_cast<int>((ai * qq) + pp);
  *k = (a > 0)? *k : -(*k);
  *l = static_cast<int>(qq);
}